

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

int i2d_EC_PUBKEY(EC_KEY *a,uchar **pp)

{
  bool bVar1;
  int iVar2;
  EVP_PKEY *pEVar3;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  UniquePtr<EVP_PKEY> pkey;
  uint8_t **outp_local;
  EC_KEY *ec_key_local;
  
  if (a == (EC_KEY *)0x0) {
    return 0;
  }
  pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)pp;
  pEVar3 = EVP_PKEY_new();
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_28,(pointer)pEVar3);
  bVar1 = std::operator==(&local_28,(nullptr_t)0x0);
  if (!bVar1) {
    pEVar3 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
    iVar2 = EVP_PKEY_set1_EC_KEY(pEVar3,a);
    if (iVar2 != 0) {
      pEVar3 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
      ec_key_local._4_4_ =
           i2d_PUBKEY(pEVar3,(uchar **)
                             pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      goto LAB_0062c76b;
    }
  }
  ec_key_local._4_4_ = -1;
LAB_0062c76b:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return ec_key_local._4_4_;
}

Assistant:

int i2d_EC_PUBKEY(const EC_KEY *ec_key, uint8_t **outp) {
  if (ec_key == NULL) {
    return 0;
  }

  bssl::UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (pkey == nullptr ||
      !EVP_PKEY_set1_EC_KEY(pkey.get(), const_cast<EC_KEY *>(ec_key))) {
    return -1;
  }

  return i2d_PUBKEY(pkey.get(), outp);
}